

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int64_t av1_block_error_lp_c(int16_t *coeff,int16_t *dqcoeff,intptr_t block_size)

{
  int64_t iVar1;
  long lVar2;
  
  lVar2 = 0;
  if (block_size < 1) {
    block_size = lVar2;
  }
  iVar1 = 0;
  for (; block_size != lVar2; lVar2 = lVar2 + 1) {
    iVar1 = iVar1 + (ulong)(uint)(((int)coeff[lVar2] - (int)dqcoeff[lVar2]) *
                                 ((int)coeff[lVar2] - (int)dqcoeff[lVar2]));
  }
  return iVar1;
}

Assistant:

int64_t av1_block_error_lp_c(const int16_t *coeff, const int16_t *dqcoeff,
                             intptr_t block_size) {
  int64_t error = 0;

  for (int i = 0; i < block_size; i++) {
    const int diff = coeff[i] - dqcoeff[i];
    error += diff * diff;
  }

  return error;
}